

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

void array_container_offset
               (array_container_t *c,container_t **loc,container_t **hic,uint16_t offset)

{
  ushort uVar1;
  bool bVar2;
  array_container_t *paVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ulong unaff_RBP;
  uint uVar8;
  int iVar9;
  array_container_t *paVar10;
  uint uVar11;
  int iVar12;
  ushort uVar13;
  ulong uVar14;
  
  if (c->cardinality == 0) {
    uVar5 = 0;
  }
  else {
    iVar12 = c->cardinality + -1;
    uVar11 = 0;
    paVar3 = c;
    do {
      if (iVar12 < (int)uVar11) {
        uVar8 = ~uVar11;
        break;
      }
      uVar8 = uVar11 + iVar12 >> 1;
      paVar10 = (array_container_t *)(ulong)uVar8;
      uVar13 = *(ushort *)((long)c->array + (ulong)(uVar11 + iVar12 & 0xfffffffe));
      if (uVar13 < (ushort)-offset) {
        uVar11 = uVar8 + 1;
        bVar2 = true;
        paVar10 = paVar3;
      }
      else if ((ushort)-offset < uVar13) {
        iVar12 = uVar8 - 1;
        bVar2 = true;
        paVar10 = paVar3;
      }
      else {
        bVar2 = false;
      }
      uVar8 = (uint)paVar10;
      paVar3 = paVar10;
    } while (bVar2);
    uVar5 = (ulong)((int)uVar8 >> 0x1f ^ uVar8);
  }
  iVar12 = (int)uVar5;
  if ((loc != (container_t **)0x0) && (iVar12 != 0)) {
    paVar3 = array_container_create_given_capacity(iVar12);
    if (0 < iVar12) {
      uVar14 = 0;
      uVar6 = uVar5;
      do {
        uVar13 = c->array[uVar14] + offset;
        iVar9 = paVar3->cardinality;
        unaff_RBP = (ulong)iVar9;
        if ((unaff_RBP == 0) || ((iVar9 != 0x7fffffff && (paVar3->array[unaff_RBP - 1] < uVar13))))
        {
          if (iVar9 == paVar3->capacity) {
            array_container_grow(paVar3,paVar3->capacity + 1,true);
          }
          iVar9 = paVar3->cardinality;
          paVar3->cardinality = iVar9 + 1;
          paVar3->array[iVar9] = uVar13;
        }
        else {
          iVar4 = iVar9 + -1;
          uVar11 = 0;
          do {
            if (iVar4 < (int)uVar11) {
              uVar6 = (ulong)~uVar11;
              break;
            }
            uVar8 = uVar11 + iVar4 >> 1;
            uVar1 = *(ushort *)((long)paVar3->array + (ulong)(uVar11 + iVar4 & 0xfffffffe));
            if (uVar1 < uVar13) {
              uVar11 = uVar8 + 1;
              bVar2 = true;
            }
            else if (uVar13 < uVar1) {
              iVar4 = uVar8 - 1;
              bVar2 = true;
            }
            else {
              bVar2 = false;
              uVar6 = (ulong)uVar8;
            }
          } while (bVar2);
          if ((iVar9 != 0x7fffffff) && ((int)(uint)uVar6 < 0)) {
            if (iVar9 == paVar3->capacity) {
              array_container_grow(paVar3,paVar3->capacity + 1,true);
            }
            uVar11 = ~(uint)uVar6;
            uVar6 = (ulong)uVar11;
            uVar11 = iVar9 - uVar11;
            unaff_RBP = (ulong)uVar11;
            memmove(paVar3->array + uVar6 + 1,paVar3->array + uVar6,(long)(int)uVar11 * 2);
            paVar3->array[uVar6] = uVar13;
            paVar3->cardinality = paVar3->cardinality + 1;
          }
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 != uVar5);
    }
    *loc = paVar3;
  }
  if ((hic != (container_t **)0x0) && (iVar9 = c->cardinality - iVar12, iVar9 != 0)) {
    paVar3 = array_container_create_given_capacity(iVar9);
    if (iVar12 < c->cardinality) {
      lVar7 = (long)iVar12;
      do {
        uVar13 = c->array[lVar7] + offset;
        iVar12 = paVar3->cardinality;
        if (((long)iVar12 == 0) ||
           ((iVar12 != 0x7fffffff && (paVar3->array[(long)iVar12 + -1] < uVar13)))) {
          if (iVar12 == paVar3->capacity) {
            array_container_grow(paVar3,paVar3->capacity + 1,true);
          }
          iVar12 = paVar3->cardinality;
          paVar3->cardinality = iVar12 + 1;
          paVar3->array[iVar12] = uVar13;
        }
        else {
          iVar9 = iVar12 + -1;
          uVar11 = 0;
          do {
            if (iVar9 < (int)uVar11) {
              unaff_RBP = (ulong)~uVar11;
              break;
            }
            uVar8 = uVar11 + iVar9 >> 1;
            uVar1 = *(ushort *)((long)paVar3->array + (ulong)(uVar11 + iVar9 & 0xfffffffe));
            if (uVar1 < uVar13) {
              uVar11 = uVar8 + 1;
              bVar2 = true;
            }
            else if (uVar13 < uVar1) {
              iVar9 = uVar8 - 1;
              bVar2 = true;
            }
            else {
              bVar2 = false;
              unaff_RBP = (ulong)uVar8;
            }
          } while (bVar2);
          if ((iVar12 != 0x7fffffff) && ((int)(uint)unaff_RBP < 0)) {
            if (iVar12 == paVar3->capacity) {
              array_container_grow(paVar3,paVar3->capacity + 1,true);
            }
            uVar11 = ~(uint)unaff_RBP;
            unaff_RBP = (ulong)uVar11;
            memmove(paVar3->array + unaff_RBP + 1,paVar3->array + unaff_RBP,
                    (long)(int)(iVar12 - uVar11) * 2);
            paVar3->array[unaff_RBP] = uVar13;
            paVar3->cardinality = paVar3->cardinality + 1;
          }
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < c->cardinality);
    }
    *hic = paVar3;
  }
  return;
}

Assistant:

void array_container_offset(const array_container_t *c, container_t **loc,
                            container_t **hic, uint16_t offset) {
    array_container_t *lo = NULL, *hi = NULL;
    int top, lo_cap, hi_cap;

    top = (1 << 16) - offset;

    lo_cap = count_less(c->array, c->cardinality, top);
    if (loc && lo_cap) {
        lo = array_container_create_given_capacity(lo_cap);
        for (int i = 0; i < lo_cap; ++i) {
            array_container_add(lo, c->array[i] + offset);
        }
        *loc = (container_t *)lo;
    }

    hi_cap = c->cardinality - lo_cap;
    if (hic && hi_cap) {
        hi = array_container_create_given_capacity(hi_cap);
        for (int i = lo_cap; i < c->cardinality; ++i) {
            array_container_add(hi, c->array[i] + offset);
        }
        *hic = (container_t *)hi;
    }
}